

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

ssize_t zip_entries_deletebyindex(zip_t *zip,size_t *entries,size_t len)

{
  uint entry_num;
  size_t sVar1;
  int iVar2;
  zip_modify_t zVar3;
  mz_bool mVar4;
  zip_entry_mark_t *entry_mark;
  size_t sVar5;
  mz_uint64 mVar6;
  long lVar7;
  ulong uVar8;
  ulong __nmemb;
  size_t index;
  ssize_t sVar9;
  mz_zip_archive_file_stat local_488;
  
  sVar9 = -1;
  if ((zip != (zip_t *)0x0) && (entries != (size_t *)0x0 || len == 0)) {
    if (entries == (size_t *)0x0 && len == 0) {
      sVar9 = 0;
    }
    else {
      entry_num = (zip->archive).m_total_files;
      __nmemb = (ulong)entry_num;
      entry_mark = (zip_entry_mark_t *)calloc(__nmemb,0x20);
      if (entry_mark == (zip_entry_mark_t *)0x0) {
        sVar9 = -0x15;
      }
      else {
        (zip->archive).m_zip_mode = MZ_ZIP_MODE_READING;
        if (entries == (size_t *)0x0) {
          sVar9 = -1;
        }
        else {
          uVar8 = 0xffffffffffffffff;
          for (index = 0; index != __nmemb; index = index + 1) {
            iVar2 = zip_entry_openbyindex(zip,index);
            if (iVar2 != 0) {
              sVar9 = (ssize_t)iVar2;
              goto LAB_0010fab6;
            }
            sVar1 = 0;
            do {
              sVar5 = sVar1;
              if (len == sVar5) {
                zVar3 = MZ_KEEP;
                goto LAB_0010f9dc;
              }
              sVar1 = sVar5 + 1;
            } while (index != entries[sVar5]);
            zVar3 = MZ_DELETE;
LAB_0010f9dc:
            entry_mark[index].type = zVar3;
            mVar4 = mz_zip_reader_file_stat(&zip->archive,(mz_uint)index,&local_488);
            if (mVar4 == 0) {
              sVar9 = -3;
              goto LAB_0010fab6;
            }
            zip_entry_close(zip);
            entry_mark[index].file_index = -1;
            entry_mark[index].lf_length = 0;
            entry_mark[index].m_local_header_ofs = local_488.m_local_header_ofs;
            mVar6 = local_488.m_local_header_ofs;
            if (uVar8 < local_488.m_local_header_ofs) {
              mVar6 = uVar8;
            }
            if (len != sVar5) {
              uVar8 = mVar6;
            }
          }
          for (lVar7 = 0; __nmemb << 5 != lVar7; lVar7 = lVar7 + 0x20) {
            if ((uVar8 < *(ulong *)((long)&entry_mark->m_local_header_ofs + lVar7)) &&
               (*(int *)((long)&entry_mark->type + lVar7) != 1)) {
              *(undefined4 *)((long)&entry_mark->type + lVar7) = 2;
            }
          }
          iVar2 = zip_entry_finalize(zip,entry_mark,__nmemb);
          if (iVar2 < 0) {
            sVar9 = (ssize_t)iVar2;
          }
          else {
            sVar9 = zip_entries_delete_mark(zip,entry_mark,entry_num);
          }
        }
LAB_0010fab6:
        free(entry_mark);
      }
    }
  }
  return sVar9;
}

Assistant:

ssize_t zip_entries_deletebyindex(struct zip_t *zip, size_t entries[],
                                  size_t len) {
  ssize_t n = 0;
  ssize_t err = 0;
  struct zip_entry_mark_t *entry_mark = NULL;

  if (zip == NULL || (entries == NULL && len != 0)) {
    return ZIP_ENOINIT;
  }

  if (entries == NULL && len == 0) {
    return 0;
  }

  n = zip_entries_total(zip);
  if (n < 0) {
    return n;
  }

  entry_mark = (struct zip_entry_mark_t *)calloc(
      (size_t)n, sizeof(struct zip_entry_mark_t));
  if (!entry_mark) {
    return ZIP_EOOMEM;
  }

  zip->archive.m_zip_mode = MZ_ZIP_MODE_READING;

  err = zip_entry_setbyindex(zip, entry_mark, (size_t)n, entries, len);
  if (err < 0) {
    CLEANUP(entry_mark);
    return err;
  }

  err = zip_entries_delete_mark(zip, entry_mark, (int)n);
  CLEANUP(entry_mark);
  return err;
}